

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::
emplaceRealloc<slang::ast::ForeachLoopStatement::LoopDim>
          (SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *this,pointer pos,
          LoopDim *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  pointer p;
  size_type sVar4;
  _Storage<slang::ConstantRange,_true> _Var5;
  undefined8 uVar6;
  pointer pLVar7;
  pointer pLVar8;
  pointer pLVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  
  if (this->len == 0x555555555555555) {
    detail::throwLengthError();
  }
  uVar11 = this->len + 1;
  uVar3 = this->cap;
  if (uVar11 < uVar3 * 2) {
    uVar11 = uVar3 * 2;
  }
  if (0x555555555555555 - uVar3 < uVar3) {
    uVar11 = 0x555555555555555;
  }
  lVar12 = (long)pos - (long)this->data_;
  pLVar9 = (pointer)operator_new(uVar11 * 0x18);
  *(IteratorSymbol **)((long)pLVar9 + lVar12 + 0x10) = args->loopVar;
  _Var5 = *(_Storage<slang::ConstantRange,_true> *)
           &(args->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ConstantRange>._M_engaged;
  *(_Storage<slang::ConstantRange,_true> *)((long)pLVar9 + lVar12) =
       (args->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
       super__Optional_payload_base<slang::ConstantRange>._M_payload;
  ((_Storage<slang::ConstantRange,_true> *)((long)pLVar9 + lVar12))[1] = _Var5;
  p = this->data_;
  sVar4 = this->len;
  lVar10 = (long)p + (sVar4 * 0x18 - (long)pos);
  pLVar7 = p;
  pLVar8 = pLVar9;
  if (lVar10 == 0) {
    if (sVar4 != 0) {
      lVar10 = 0;
      do {
        *(undefined8 *)((long)&pLVar9->loopVar + lVar10) =
             *(undefined8 *)((long)&p->loopVar + lVar10);
        puVar1 = (undefined8 *)
                 ((long)&(p->range).super__Optional_base<slang::ConstantRange,_true,_true>.
                         _M_payload.super__Optional_payload_base<slang::ConstantRange>._M_payload +
                 lVar10);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)
                 ((long)&(pLVar9->range).super__Optional_base<slang::ConstantRange,_true,_true>.
                         _M_payload.super__Optional_payload_base<slang::ConstantRange>._M_payload +
                 lVar10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        lVar10 = lVar10 + 0x18;
      } while (sVar4 * 0x18 != lVar10);
    }
  }
  else {
    for (; pLVar7 != pos; pLVar7 = pLVar7 + 1) {
      pLVar8->loopVar = pLVar7->loopVar;
      uVar6 = *(undefined8 *)
               &(pLVar7->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ConstantRange>._M_engaged;
      (pLVar8->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ConstantRange>._M_payload =
           (pLVar7->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ConstantRange>._M_payload;
      *(undefined8 *)
       &(pLVar8->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ConstantRange>._M_engaged = uVar6;
      pLVar8 = pLVar8 + 1;
    }
    memcpy((void *)((long)pLVar9 + lVar12 + 0x18),pos,((lVar10 - 0x18U) / 0x18) * 0x18 + 0x18);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar11;
  this->data_ = pLVar9;
  return (pointer)((long)pLVar9 + lVar12);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}